

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

int __thiscall QDate::dayOfYear(QDate *this)

{
  int year;
  int iVar1;
  optional<long_long> oVar2;
  YearMonthDay YVar3;
  
  iVar1 = 0;
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    YVar3 = QGregorianCalendar::partsFromJulian(this->jd);
    iVar1 = 0;
    year = YVar3.year;
    if (YVar3.month == -0x80000000) {
      year = iVar1;
    }
    oVar2 = QGregorianCalendar::julianFromParts(year,1,1);
    if (((undefined1  [16])
         oVar2.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
      iVar1 = ((int)this->jd -
              oVar2.super__Optional_base<long_long,_true,_true>._M_payload.
              super__Optional_payload_base<long_long>._M_payload._0_4_) + 1;
    }
  }
  return iVar1;
}

Assistant:

int QDate::dayOfYear() const
{
    if (isValid()) {
        if (const auto first = QGregorianCalendar::julianFromParts(year(), 1, 1))
            return jd - *first + 1;
    }
    return 0;
}